

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffGetSlot
          (NodeDiffComputer *this,GetSlotExpr *lhs,GetSlotExpr *rhs)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  
  iVar1 = diffNodes(this,&((lhs->super_SlotAccessExpr).super_AccessExpr._receiver)->super_Node,
                    &((rhs->super_SlotAccessExpr).super_AccessExpr._receiver)->super_Node);
  iVar2 = iVar1;
  if ((iVar1 <= this->limit) &&
     (iVar2 = diffNodes(this,&((lhs->super_SlotAccessExpr)._key)->super_Node,
                        &((rhs->super_SlotAccessExpr)._key)->super_Node), iVar2 <= this->limit)) {
    iVar3 = 0;
    if ((lhs->super_SlotAccessExpr).super_AccessExpr._nullable !=
        (rhs->super_SlotAccessExpr).super_AccessExpr._nullable) {
      iVar3 = (this->DiffCosts).NullabilityDiffCost;
    }
    iVar2 = iVar2 + iVar1 + iVar3;
  }
  return iVar2;
}

Assistant:

int32_t diffGetSlot(const GetSlotExpr *lhs, const GetSlotExpr *rhs) {
    int32_t receiverDiff = diffNodes(lhs->receiver(), rhs->receiver());

    if (receiverDiff > limit)
      return receiverDiff;

    int32_t keyDiff = diffNodes(lhs->key(), rhs->key());

    if (keyDiff > limit)
      return keyDiff;

    if (lhs->isNullable() != rhs->isNullable())
      receiverDiff += DiffCosts.NullabilityDiffCost;

    return receiverDiff + keyDiff;
  }